

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::CalcItemSize(ImVec2 size,float default_w,float default_h)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = size.x;
  fVar4 = size.y;
  pIVar1 = GImGui->CurrentWindow;
  if ((fVar5 < 0.0) || (IVar2.x = 0.0, IVar2.y = 0.0, fVar4 < 0.0)) {
    IVar2 = GetContentRegionMaxAbs();
  }
  if (((fVar5 != 0.0) || (NAN(fVar5))) && (default_w = fVar5, fVar5 < 0.0)) {
    fVar5 = (IVar2.x - (pIVar1->DC).CursorPos.x) + fVar5;
    default_w = 4.0;
    if (4.0 <= fVar5) {
      default_w = fVar5;
    }
  }
  if (((fVar4 != 0.0) || (NAN(fVar4))) && (default_h = fVar4, fVar4 < 0.0)) {
    fVar4 = fVar4 + (IVar2.y - (pIVar1->DC).CursorPos.y);
    default_h = 4.0;
    if (4.0 <= fVar4) {
      default_h = fVar4;
    }
  }
  IVar3.y = default_h;
  IVar3.x = default_w;
  return IVar3;
}

Assistant:

ImVec2 ImGui::CalcItemSize(ImVec2 size, float default_w, float default_h)
{
    ImGuiWindow* window = GImGui->CurrentWindow;

    ImVec2 region_max;
    if (size.x < 0.0f || size.y < 0.0f)
        region_max = GetContentRegionMaxAbs();

    if (size.x == 0.0f)
        size.x = default_w;
    else if (size.x < 0.0f)
        size.x = ImMax(4.0f, region_max.x - window->DC.CursorPos.x + size.x);

    if (size.y == 0.0f)
        size.y = default_h;
    else if (size.y < 0.0f)
        size.y = ImMax(4.0f, region_max.y - window->DC.CursorPos.y + size.y);

    return size;
}